

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

void __thiscall AActor::Serialize(AActor *this,FSerializer *arc)

{
  BYTE *pBVar1;
  int iVar2;
  undefined4 extraout_var;
  FSerializer *pFVar3;
  TAngle<double> *pTVar4;
  TAngle<double> *pTVar5;
  DObject *v;
  AActor *local_38;
  
  if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
    iVar2 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
    (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar2);
  }
  pBVar1 = ((this->super_DThinker).super_DObject.Class)->Defaults;
  DObject::Serialize((DObject *)this,arc);
  pFVar3 = FSerializer::Sprite(arc,"sprite",&this->sprite,(int32_t *)(pBVar1 + 0xf0));
  pTVar5 = (TAngle<double> *)0x0;
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x48);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = FSerializer::Array<double>(pFVar3,"pos",&(this->__Pos).X,&pTVar4->Degrees,3,true);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0xa8);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = FSerializer::Array<TAngle<double>>(pFVar3,"angles",&(this->Angles).Pitch,pTVar4,3,true);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0xf4);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"frame",&this->frame,(uint8_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0xf8);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = FSerializer::Array<double>(pFVar3,"scale",&(this->Scale).X,&pTVar4->Degrees,2,true);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x108);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = FSerializer::Array<unsigned_char>
                     (pFVar3,"renderstyle",(uchar *)&(this->RenderStyle).AsDWORD,(uchar *)pTVar4,4,
                      false);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x10c);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"renderflags",&(this->renderflags).Value,(uint32_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x110);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"picnum",&this->picnum,(FTextureID *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x160);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"floorpic",&this->floorpic,(FTextureID *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x170);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"ceilingpic",&this->ceilingpic,(FTextureID *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x268);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"tidtohate",&this->TIDtoHate,(int32_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x2d6);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"lastlookpn",&this->LastLookPlayerNumber,(int8_t *)pTVar4);
  ::Serialize(pFVar3,"lastlookactor",(DObject **)&this->LastLookActor,(DObject **)0x0,(bool *)0x0);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x114);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"effects",&this->effects,(uint32_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x118);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"alpha",&this->Alpha,&pTVar4->Degrees);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x120);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"fillcolor",&this->fillcolor,(uint32_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x130);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = Serialize<sector_t>(pFVar3,"sector",(sector_t_conflict **)&this->Sector,
                               (sector_t_conflict **)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x140);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"floorz",&this->floorz,&pTVar4->Degrees);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x148);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"ceilingz",&this->ceilingz,&pTVar4->Degrees);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x150);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"dropoffz",&this->dropoffz,&pTVar4->Degrees);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x158);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = Serialize<sector_t>(pFVar3,"floorsector",(sector_t_conflict **)&this->floorsector,
                               (sector_t_conflict **)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x168);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = Serialize<sector_t>(pFVar3,"ceilingsector",(sector_t_conflict **)&this->ceilingsector,
                               (sector_t_conflict **)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x178);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"radius",&this->radius,&pTVar4->Degrees);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x188);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"renderradius",&this->renderradius,&pTVar4->Degrees);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x180);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"height",&this->Height,&pTVar4->Degrees);
  pTVar4 = (TAngle<double> *)(pBVar1 + 400);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"ppassheight",&this->projectilepassheight,&pTVar4->Degrees);
  pTVar4 = (TAngle<double> *)(pBVar1 + 200);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = FSerializer::Array<double>(pFVar3,"vel",&(this->Vel).X,&pTVar4->Degrees,3,true);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x198);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"tics",&this->tics,(int32_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x1a0);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"state",&this->state,(FState **)pTVar4,(bool *)0x0);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x1a8);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"damage",&this->DamageVal,(int32_t *)pTVar4);
  pFVar3 = FSerializer::Terrain(pFVar3,"floorterrain",&this->floorterrain,(int *)(pBVar1 + 0x164));
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x1b8);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"projectilekickback",&this->projectileKickback,(int32_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x1bc);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"flags",&(this->flags).Value,(uint32_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x1c0);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"flags2",&(this->flags2).Value,(uint32_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x1c4);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"flags3",&(this->flags3).Value,(uint32_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x1c8);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"flags4",&(this->flags4).Value,(uint32_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x1cc);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"flags5",&(this->flags5).Value,(uint32_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x1d0);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"flags6",&(this->flags6).Value,(uint32_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x1d4);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"flags7",&(this->flags7).Value,(uint32_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x1f8);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"weaponspecial",&this->weaponspecial,(int32_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x1dc);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"special1",&this->special1,(int32_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x1e0);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"special2",&this->special2,(int32_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x1e8);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"specialf1",&this->specialf1,&pTVar4->Degrees);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x1f0);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"specialf2",&this->specialf2,&pTVar4->Degrees);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x1fc);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"health",&this->health,(int32_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x200);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"movedir",&this->movedir,(uint8_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x201);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"visdir",&this->visdir,(int8_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x202);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"movecount",&this->movecount,(int16_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x204);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"strafecount",&this->strafecount,(int16_t *)pTVar4);
  ::Serialize(pFVar3,"target",(DObject **)&this->target,(DObject **)0x0,(bool *)0x0);
  ::Serialize(pFVar3,"lastenemy",(DObject **)&this->lastenemy,(DObject **)0x0,(bool *)0x0);
  ::Serialize(pFVar3,"lastheard",(DObject **)&this->LastHeard,(DObject **)0x0,(bool *)0x0);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x220);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"reactiontime",&this->reactiontime,(int32_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x224);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"threshold",&this->threshold,(int32_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x230);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = Serialize<player_t>(pFVar3,"player",&this->player,(player_t **)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x240);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = FSerializer::Array<double>
                     (pFVar3,"spawnpoint",&(this->SpawnPoint).X,&pTVar4->Degrees,3,true);
  pTVar4 = (TAngle<double> *)(pBVar1 + 600);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"spawnangle",&this->SpawnAngle,(uint16_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x25c);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"starthealth",&this->StartHealth,(int32_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x264);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"skillrespawncount",&this->skillrespawncount,(int32_t *)pTVar4);
  ::Serialize(pFVar3,"tracer",(DObject **)&this->tracer,(DObject **)0x0,(bool *)0x0);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x288);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"floorclip",&this->Floorclip,&pTVar4->Degrees);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x290);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"tid",&this->tid,(int32_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x294);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"special",&this->special,(int32_t *)pTVar4);
  pFVar3 = FSerializer::Args(pFVar3,"args",this->args,(int *)(pBVar1 + 0x298),this->special);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x2ac);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"accuracy",&this->accuracy,(int32_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x2b0);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"stamina",&this->stamina,(int32_t *)pTVar4);
  ::Serialize(pFVar3,"goal",(DObject **)&this->goal,(DObject **)0x0,(bool *)0x0);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x2d0);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"waterlevel",&this->waterlevel,(int32_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x2d5);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"minmissilechance",&this->MinMissileChance,(uint8_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x2dc);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"spawnflags",&this->SpawnFlags,(uint32_t *)pTVar4);
  ::Serialize(pFVar3,"inventory",(DObject **)&this->Inventory,(DObject **)0x0,(bool *)0x0);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x3b8);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"inventoryid",&this->InventoryID,(uint32_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x3bd);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"floatbobphase",&this->FloatBobPhase,(uint8_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x3c0);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"translation",&this->Translation,(uint32_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x3c4);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"seesound",&(this->SeeSound).super_FSoundID,(FSoundID *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x3c8);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"attacksound",&(this->AttackSound).super_FSoundID,(FSoundID *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x3cc);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"paimsound",&(this->PainSound).super_FSoundID,(FSoundID *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x3d0);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"deathsound",&(this->DeathSound).super_FSoundID,(FSoundID *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x3d4);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"activesound",&(this->ActiveSound).super_FSoundID,(FSoundID *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x3d8);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"usesound",&(this->UseSound).super_FSoundID,(FSoundID *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x3dc);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"bouncesound",&(this->BounceSound).super_FSoundID,(FSoundID *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x3e0);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"wallbouncesound",&(this->WallBounceSound).super_FSoundID,
                       (FSoundID *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x3e4);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"crushpainsound",&(this->CrushPainSound).super_FSoundID,
                       (FSoundID *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0xe0);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"speed",&this->Speed,&pTVar4->Degrees);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0xe8);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"floatspeed",&this->FloatSpeed,&pTVar4->Degrees);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x3f8);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"mass",&this->Mass,(int32_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x3fc);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"painchance",&this->PainChance,(int16_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x448);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"spawnstate",&this->SpawnState,(FState **)pTVar4,(bool *)0x0);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x450);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"seestate",&this->SeeState,(FState **)pTVar4,(bool *)0x0);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x458);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"meleestate",&this->MeleeState,(FState **)pTVar4,(bool *)0x0);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x460);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"missilestate",&this->MissileState,(FState **)pTVar4,(bool *)0x0);
  pTVar4 = (TAngle<double> *)(pBVar1 + 1000);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"maxdropoffheight",&this->MaxDropOffHeight,&pTVar4->Degrees);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x3f0);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"maxstepheight",&this->MaxStepHeight,&pTVar4->Degrees);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x2d8);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"bounceflags",&(this->BounceFlags).Value,(uint16_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x2f8);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"bouncefactor",&this->bouncefactor,&pTVar4->Degrees);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x300);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"wallbouncefactor",&this->wallbouncefactor,&pTVar4->Degrees);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x308);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"bouncecount",&this->bouncecount,(int32_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x2f0);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"maxtargetrange",&this->maxtargetrange,&pTVar4->Degrees);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x2e8);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"meleethreshold",&this->meleethreshold,&pTVar4->Degrees);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x2e0);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"meleerange",&this->meleerange,&pTVar4->Degrees);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x404);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"damagetype",&(this->DamageType).super_FName,(FName *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x408);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"damagetypereceived",&(this->DamageTypeReceived).super_FName,
                       (FName *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x420);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"paintype",&(this->PainType).super_FName,(FName *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x424);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"deathtype",&(this->DeathType).super_FName,(FName *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x310);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"gravity",&this->Gravity,&pTVar4->Degrees);
  pTVar4 = (TAngle<double> *)(pBVar1 + 800);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"fastchasestrafecount",&this->FastChaseStrafeCount,(int32_t *)pTVar4);
  ::Serialize(pFVar3,"master",(DObject **)&this->master,(DObject **)0x0,(bool *)0x0);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x3bc);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"smokecounter",&this->smokecounter,(uint8_t *)pTVar4);
  local_38 = this->BlockingMobj;
  ::Serialize(pFVar3,"blockingmobj",(DObject **)&local_38,(DObject **)0x0,(bool *)0x0);
  this->BlockingMobj = local_38;
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x358);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = Serialize<line_t>(pFVar3,"blockingline",(line_t_conflict **)&this->BlockingLine,
                             (line_t_conflict **)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x1d8);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"visibletoteam",&this->VisibleToTeam,(uint32_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x328);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"pushfactor",&this->pushfactor,&pTVar4->Degrees);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x26c);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"species",&(this->Species).super_FName,(FName *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x33c);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"score",&this->Score,(int32_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x348);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"designatedteam",&this->DesignatedTeam,(int32_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x330);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"lastpush",&this->lastpush,(int32_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x338);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"lastbump",&this->lastbump,(int32_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x400);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"painthreshold",&this->PainThreshold,(int32_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x410);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"damagefactor",&this->DamageFactor,&pTVar4->Degrees);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x418);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"damagemultiply",&this->DamageMultiply,&pTVar4->Degrees);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x260);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"waveindexxy",&this->WeaveIndexXY,(uint8_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x261);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"weaveindexz",&this->WeaveIndexZ,(uint8_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x370);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"pdmgreceived",&this->PoisonDamageReceived,(int32_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x378);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"pdurreceived",&this->PoisonDurationReceived,(int32_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x37c);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"ppreceived",&this->PoisonPeriodReceived,(int32_t *)pTVar4);
  ::Serialize(pFVar3,"poisoner",(DObject **)&this->Poisoner,(DObject **)0x0,(bool *)0x0);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x360);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"posiondamage",&this->PoisonDamage,(int32_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x368);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"poisonduration",&this->PoisonDuration,(int32_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x36c);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"poisonperiod",&this->PoisonPeriod,(int32_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x364);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"poisondamagetype",&(this->PoisonDamageType).super_FName,
                       (FName *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x374);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"poisondmgtypereceived",&(this->PoisonDamageTypeReceived).super_FName,
                       (FName *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x468);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"conversationroot",&this->ConversationRoot,(int32_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x470);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = Serialize<FStrifeDialogueNode>
                     (pFVar3,"conversation",&this->Conversation,(FStrifeDialogueNode **)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x3be);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"friendplayer",&this->FriendPlayer,(uint8_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x428);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = Serialize<PClassActor>
                     (pFVar3,"telefogsourcetype",&this->TeleFogSourceType,(PClassActor **)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x430);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = Serialize<PClassActor>
                     (pFVar3,"telefogdesttype",&this->TeleFogDestType,(PClassActor **)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x438);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"ripperlevel",&this->RipperLevel,(int32_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x43c);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"riplevelmin",&this->RipLevelMin,(int32_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x440);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"riplevelmax",&this->RipLevelMax,(int32_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x228);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"devthreshold",&this->DefThreshold,(int32_t *)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x78);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"spriteangle",&(this->SpriteAngle).Degrees,&pTVar4->Degrees);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x80);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"spriterotation",&(this->SpriteRotation).Degrees,&pTVar4->Degrees);
  ::Serialize(pFVar3,"alternative",(DObject **)&this->alternative,(DObject **)0x0,(bool *)0x0);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x340);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = Serialize<FString>(pFVar3,"tag",&this->Tag,(FString **)pTVar4);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x88);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"visiblestartangle",&(this->VisibleStartAngle).Degrees,
                       &pTVar4->Degrees);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x98);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"visibleendangle",&(this->VisibleEndAngle).Degrees,&pTVar4->Degrees);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0x90);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  pFVar3 = ::Serialize(pFVar3,"visiblestartpitch",&(this->VisibleStartPitch).Degrees,
                       &pTVar4->Degrees);
  pTVar4 = (TAngle<double> *)(pBVar1 + 0xa0);
  if (save_full != false) {
    pTVar4 = pTVar5;
  }
  ::Serialize(pFVar3,"visibleendpitch",&(this->VisibleEndPitch).Degrees,&pTVar4->Degrees);
  return;
}

Assistant:

void AActor::Serialize(FSerializer &arc)
{
	AActor *def = GetDefault();

	Super::Serialize(arc);

	arc
		.Sprite("sprite", sprite, &def->sprite)
		A("pos", __Pos)
		A("angles", Angles)
		A("frame", frame)
		A("scale", Scale)
		A("renderstyle", RenderStyle)
		A("renderflags", renderflags)
		A("picnum", picnum)
		A("floorpic", floorpic)
		A("ceilingpic", ceilingpic)
		A("tidtohate", TIDtoHate)
		A("lastlookpn", LastLookPlayerNumber)
		("lastlookactor", LastLookActor)
		A("effects", effects)
		A("alpha", Alpha)
		A("fillcolor", fillcolor)
		A("sector", Sector)
		A("floorz", floorz)
		A("ceilingz", ceilingz)
		A("dropoffz", dropoffz)
		A("floorsector", floorsector)
		A("ceilingsector", ceilingsector)
		A("radius", radius)
		A("renderradius", renderradius)
		A("height", Height)
		A("ppassheight", projectilepassheight)
		A("vel", Vel)
		A("tics", tics)
		A("state", state)
		A("damage", DamageVal)
		.Terrain("floorterrain", floorterrain, &def->floorterrain)
		A("projectilekickback", projectileKickback)
		A("flags", flags)
		A("flags2", flags2)
		A("flags3", flags3)
		A("flags4", flags4)
		A("flags5", flags5)
		A("flags6", flags6)
		A("flags7", flags7)
		A("weaponspecial", weaponspecial)
		A("special1", special1)
		A("special2", special2)
		A("specialf1", specialf1)
		A("specialf2", specialf2)
		A("health", health)
		A("movedir", movedir)
		A("visdir", visdir)
		A("movecount", movecount)
		A("strafecount", strafecount)
		("target", target)
		("lastenemy", lastenemy)
		("lastheard", LastHeard)
		A("reactiontime", reactiontime)
		A("threshold", threshold)
		A("player", player)
		A("spawnpoint", SpawnPoint)
		A("spawnangle", SpawnAngle)
		A("starthealth", StartHealth)
		A("skillrespawncount", skillrespawncount)
		("tracer", tracer)
		A("floorclip", Floorclip)
		A("tid", tid)
		A("special", special)
		.Args("args", args, def->args, special)
		A("accuracy", accuracy)
		A("stamina", stamina)
		("goal", goal)
		A("waterlevel", waterlevel)
		A("minmissilechance", MinMissileChance)
		A("spawnflags", SpawnFlags)
		("inventory", Inventory)
		A("inventoryid", InventoryID)
		A("floatbobphase", FloatBobPhase)
		A("translation", Translation)
		A("seesound", SeeSound)
		A("attacksound", AttackSound)
		A("paimsound", PainSound)
		A("deathsound", DeathSound)
		A("activesound", ActiveSound)
		A("usesound", UseSound)
		A("bouncesound", BounceSound)
		A("wallbouncesound", WallBounceSound)
		A("crushpainsound", CrushPainSound)
		A("speed", Speed)
		A("floatspeed", FloatSpeed)
		A("mass", Mass)
		A("painchance", PainChance)
		A("spawnstate", SpawnState)
		A("seestate", SeeState)
		A("meleestate", MeleeState)
		A("missilestate", MissileState)
		A("maxdropoffheight", MaxDropOffHeight)
		A("maxstepheight", MaxStepHeight)
		A("bounceflags", BounceFlags)
		A("bouncefactor", bouncefactor)
		A("wallbouncefactor", wallbouncefactor)
		A("bouncecount", bouncecount)
		A("maxtargetrange", maxtargetrange)
		A("meleethreshold", meleethreshold)
		A("meleerange", meleerange)
		A("damagetype", DamageType)
		A("damagetypereceived", DamageTypeReceived)
		A("paintype", PainType)
		A("deathtype", DeathType)
		A("gravity", Gravity)
		A("fastchasestrafecount", FastChaseStrafeCount)
		("master", master)
		A("smokecounter", smokecounter)
		("blockingmobj", BlockingMobj)
		A("blockingline", BlockingLine)
		A("visibletoteam", VisibleToTeam)
		A("pushfactor", pushfactor)
		A("species", Species)
		A("score", Score)
		A("designatedteam", DesignatedTeam)
		A("lastpush", lastpush)
		A("lastbump", lastbump)
		A("painthreshold", PainThreshold)
		A("damagefactor", DamageFactor)
		A("damagemultiply", DamageMultiply)
		A("waveindexxy", WeaveIndexXY)
		A("weaveindexz", WeaveIndexZ)
		A("pdmgreceived", PoisonDamageReceived)
		A("pdurreceived", PoisonDurationReceived)
		A("ppreceived", PoisonPeriodReceived)
		("poisoner", Poisoner)
		A("posiondamage", PoisonDamage)
		A("poisonduration", PoisonDuration)
		A("poisonperiod", PoisonPeriod)
		A("poisondamagetype", PoisonDamageType)
		A("poisondmgtypereceived", PoisonDamageTypeReceived)
		A("conversationroot", ConversationRoot)
		A("conversation", Conversation)
		A("friendplayer", FriendPlayer)
		A("telefogsourcetype", TeleFogSourceType)
		A("telefogdesttype", TeleFogDestType)
		A("ripperlevel", RipperLevel)
		A("riplevelmin", RipLevelMin)
		A("riplevelmax", RipLevelMax)
		A("devthreshold", DefThreshold)
		A("spriteangle", SpriteAngle)
		A("spriterotation", SpriteRotation)
		("alternative", alternative)
		A("tag", Tag)
		A("visiblestartangle",VisibleStartAngle)
		A("visibleendangle",VisibleEndAngle)
		A("visiblestartpitch",VisibleStartPitch)
		A("visibleendpitch",VisibleEndPitch);
}